

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_string_cat3(sexp ctx,char *pre,char *mid,char *suf)

{
  sexp psVar1;
  sexp psVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  sexp psVar8;
  char *__dest;
  
  sVar5 = strlen(pre);
  sVar6 = strlen(mid);
  sVar7 = strlen(suf);
  iVar3 = (int)sVar6;
  iVar4 = (int)sVar5;
  psVar8 = sexp_make_string_op(ctx,(sexp)0x0,2,(sexp)((long)(iVar3 + iVar4 + (int)sVar7) * 2 + 1),
                               (sexp)&DAT_0000043e);
  psVar1 = (psVar8->value).type.name;
  psVar2 = (psVar8->value).type.cpl;
  memcpy((psVar1->value).flonum_bits + 8 + (long)psVar2,pre,(long)iVar4);
  __dest = (psVar2->value).flonum_bits + (long)&psVar1->value + (long)iVar4;
  memcpy(__dest,mid,(long)iVar3);
  memcpy(__dest + iVar3,suf,(long)(int)sVar7);
  return psVar8;
}

Assistant:

sexp sexp_string_cat3 (sexp ctx, const char *pre, const char *mid, const char* suf) {
  int plen=strlen(pre), mlen=strlen(mid), slen=strlen(suf);
  char *s;
  sexp str;
  str = sexp_make_string(ctx, sexp_make_fixnum(plen+mlen+slen), SEXP_VOID);
  memcpy(s=sexp_string_data(str), pre, plen);
  memcpy(s+plen, mid, mlen);
  memcpy(s+plen+mlen, suf, slen);
  return str;
}